

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

uint8_t * __thiscall
CoreML::Specification::Pooling3DLayerParams::_InternalSerialize
          (Pooling3DLayerParams *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  void *data;
  bool bVar1;
  uint8_t *puVar2;
  uint8_t *puVar3;
  ulong uVar4;
  ulong uVar5;
  uint8_t uVar6;
  uint uVar7;
  int size;
  ulong uVar8;
  size_t __n;
  
  uVar7 = this->type_;
  if (uVar7 != 0) {
    puVar2 = target;
    if (stream->end_ <= target) {
      puVar2 = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      uVar7 = this->type_;
    }
    *puVar2 = '\b';
    puVar2[1] = (byte)uVar7;
    if (uVar7 < 0x80) {
      target = puVar2 + 2;
    }
    else {
      puVar2[1] = (byte)uVar7 | 0x80;
      puVar2[2] = (uint8_t)((ulong)(long)(int)uVar7 >> 7);
      target = puVar2 + 3;
      if (0x3fff < uVar7) {
        uVar8 = (ulong)puVar2[2];
        uVar5 = (ulong)(long)(int)uVar7 >> 7;
        do {
          target[-1] = (byte)uVar8 | 0x80;
          uVar4 = uVar5 >> 7;
          *target = (uint8_t)uVar4;
          target = target + 1;
          uVar8 = uVar4 & 0xffffffff;
          bVar1 = 0x3fff < uVar5;
          uVar5 = uVar4;
        } while (bVar1);
      }
    }
  }
  uVar7 = this->kerneldepth_;
  puVar2 = target;
  if (uVar7 != 0) {
    if (stream->end_ <= target) {
      target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      uVar7 = this->kerneldepth_;
    }
    *target = '\x10';
    target[1] = (byte)uVar7;
    if (uVar7 < 0x80) {
      puVar2 = target + 2;
    }
    else {
      target[1] = (byte)uVar7 | 0x80;
      target[2] = (uint8_t)((ulong)(long)(int)uVar7 >> 7);
      puVar2 = target + 3;
      if (0x3fff < uVar7) {
        uVar8 = (ulong)target[2];
        uVar5 = (ulong)(long)(int)uVar7 >> 7;
        do {
          puVar2[-1] = (byte)uVar8 | 0x80;
          uVar4 = uVar5 >> 7;
          *puVar2 = (uint8_t)uVar4;
          puVar2 = puVar2 + 1;
          uVar8 = uVar4 & 0xffffffff;
          bVar1 = 0x3fff < uVar5;
          uVar5 = uVar4;
        } while (bVar1);
      }
    }
  }
  uVar7 = this->kernelheight_;
  if (uVar7 != 0) {
    puVar3 = puVar2;
    if (stream->end_ <= puVar2) {
      puVar3 = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,puVar2);
      uVar7 = this->kernelheight_;
    }
    *puVar3 = '\x18';
    puVar3[1] = (byte)uVar7;
    if (uVar7 < 0x80) {
      puVar2 = puVar3 + 2;
    }
    else {
      puVar3[1] = (byte)uVar7 | 0x80;
      puVar3[2] = (uint8_t)((ulong)(long)(int)uVar7 >> 7);
      puVar2 = puVar3 + 3;
      if (0x3fff < uVar7) {
        uVar8 = (ulong)puVar3[2];
        uVar5 = (ulong)(long)(int)uVar7 >> 7;
        do {
          puVar2[-1] = (byte)uVar8 | 0x80;
          uVar4 = uVar5 >> 7;
          *puVar2 = (uint8_t)uVar4;
          puVar2 = puVar2 + 1;
          uVar8 = uVar4 & 0xffffffff;
          bVar1 = 0x3fff < uVar5;
          uVar5 = uVar4;
        } while (bVar1);
      }
    }
  }
  uVar7 = this->kernelwidth_;
  puVar3 = puVar2;
  if (uVar7 != 0) {
    if (stream->end_ <= puVar2) {
      puVar2 = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,puVar2);
      uVar7 = this->kernelwidth_;
    }
    *puVar2 = ' ';
    puVar2[1] = (byte)uVar7;
    if (uVar7 < 0x80) {
      puVar3 = puVar2 + 2;
    }
    else {
      puVar2[1] = (byte)uVar7 | 0x80;
      puVar2[2] = (uint8_t)((ulong)(long)(int)uVar7 >> 7);
      puVar3 = puVar2 + 3;
      if (0x3fff < uVar7) {
        uVar8 = (ulong)puVar2[2];
        uVar5 = (ulong)(long)(int)uVar7 >> 7;
        do {
          puVar3[-1] = (byte)uVar8 | 0x80;
          uVar4 = uVar5 >> 7;
          *puVar3 = (uint8_t)uVar4;
          puVar3 = puVar3 + 1;
          uVar8 = uVar4 & 0xffffffff;
          bVar1 = 0x3fff < uVar5;
          uVar5 = uVar4;
        } while (bVar1);
      }
    }
  }
  uVar7 = this->stridedepth_;
  if (uVar7 != 0) {
    puVar2 = puVar3;
    if (stream->end_ <= puVar3) {
      puVar2 = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,puVar3);
      uVar7 = this->stridedepth_;
    }
    *puVar2 = '(';
    puVar2[1] = (byte)uVar7;
    if (uVar7 < 0x80) {
      puVar3 = puVar2 + 2;
    }
    else {
      puVar2[1] = (byte)uVar7 | 0x80;
      puVar2[2] = (uint8_t)((ulong)(long)(int)uVar7 >> 7);
      puVar3 = puVar2 + 3;
      if (0x3fff < uVar7) {
        uVar8 = (ulong)puVar2[2];
        uVar5 = (ulong)(long)(int)uVar7 >> 7;
        do {
          puVar3[-1] = (byte)uVar8 | 0x80;
          uVar4 = uVar5 >> 7;
          *puVar3 = (uint8_t)uVar4;
          puVar3 = puVar3 + 1;
          uVar8 = uVar4 & 0xffffffff;
          bVar1 = 0x3fff < uVar5;
          uVar5 = uVar4;
        } while (bVar1);
      }
    }
  }
  uVar7 = this->strideheight_;
  puVar2 = puVar3;
  if (uVar7 != 0) {
    if (stream->end_ <= puVar3) {
      puVar3 = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,puVar3);
      uVar7 = this->strideheight_;
    }
    *puVar3 = '0';
    puVar3[1] = (byte)uVar7;
    if (uVar7 < 0x80) {
      puVar2 = puVar3 + 2;
    }
    else {
      puVar3[1] = (byte)uVar7 | 0x80;
      puVar3[2] = (uint8_t)((ulong)(long)(int)uVar7 >> 7);
      puVar2 = puVar3 + 3;
      if (0x3fff < uVar7) {
        uVar8 = (ulong)puVar3[2];
        uVar5 = (ulong)(long)(int)uVar7 >> 7;
        do {
          puVar2[-1] = (byte)uVar8 | 0x80;
          uVar4 = uVar5 >> 7;
          *puVar2 = (uint8_t)uVar4;
          puVar2 = puVar2 + 1;
          uVar8 = uVar4 & 0xffffffff;
          bVar1 = 0x3fff < uVar5;
          uVar5 = uVar4;
        } while (bVar1);
      }
    }
  }
  uVar7 = this->stridewidth_;
  if (uVar7 != 0) {
    puVar3 = puVar2;
    if (stream->end_ <= puVar2) {
      puVar3 = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,puVar2);
      uVar7 = this->stridewidth_;
    }
    *puVar3 = '8';
    puVar3[1] = (byte)uVar7;
    if (uVar7 < 0x80) {
      puVar2 = puVar3 + 2;
    }
    else {
      puVar3[1] = (byte)uVar7 | 0x80;
      puVar3[2] = (uint8_t)((ulong)(long)(int)uVar7 >> 7);
      puVar2 = puVar3 + 3;
      if (0x3fff < uVar7) {
        uVar8 = (ulong)puVar3[2];
        uVar5 = (ulong)(long)(int)uVar7 >> 7;
        do {
          puVar2[-1] = (byte)uVar8 | 0x80;
          uVar4 = uVar5 >> 7;
          *puVar2 = (uint8_t)uVar4;
          puVar2 = puVar2 + 1;
          uVar8 = uVar4 & 0xffffffff;
          bVar1 = 0x3fff < uVar5;
          uVar5 = uVar4;
        } while (bVar1);
      }
    }
  }
  uVar7 = this->custompaddingfront_;
  puVar3 = puVar2;
  if (uVar7 != 0) {
    if (stream->end_ <= puVar2) {
      puVar2 = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,puVar2);
      uVar7 = this->custompaddingfront_;
    }
    *puVar2 = '@';
    puVar2[1] = (byte)uVar7;
    if (uVar7 < 0x80) {
      puVar3 = puVar2 + 2;
    }
    else {
      puVar2[1] = (byte)uVar7 | 0x80;
      puVar2[2] = (uint8_t)((ulong)(long)(int)uVar7 >> 7);
      puVar3 = puVar2 + 3;
      if (0x3fff < uVar7) {
        uVar8 = (ulong)puVar2[2];
        uVar5 = (ulong)(long)(int)uVar7 >> 7;
        do {
          puVar3[-1] = (byte)uVar8 | 0x80;
          uVar4 = uVar5 >> 7;
          *puVar3 = (uint8_t)uVar4;
          puVar3 = puVar3 + 1;
          uVar8 = uVar4 & 0xffffffff;
          bVar1 = 0x3fff < uVar5;
          uVar5 = uVar4;
        } while (bVar1);
      }
    }
  }
  uVar7 = this->custompaddingback_;
  if (uVar7 != 0) {
    puVar2 = puVar3;
    if (stream->end_ <= puVar3) {
      puVar2 = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,puVar3);
      uVar7 = this->custompaddingback_;
    }
    *puVar2 = 'H';
    puVar2[1] = (byte)uVar7;
    if (uVar7 < 0x80) {
      puVar3 = puVar2 + 2;
    }
    else {
      puVar2[1] = (byte)uVar7 | 0x80;
      puVar2[2] = (uint8_t)((ulong)(long)(int)uVar7 >> 7);
      puVar3 = puVar2 + 3;
      if (0x3fff < uVar7) {
        uVar8 = (ulong)puVar2[2];
        uVar5 = (ulong)(long)(int)uVar7 >> 7;
        do {
          puVar3[-1] = (byte)uVar8 | 0x80;
          uVar4 = uVar5 >> 7;
          *puVar3 = (uint8_t)uVar4;
          puVar3 = puVar3 + 1;
          uVar8 = uVar4 & 0xffffffff;
          bVar1 = 0x3fff < uVar5;
          uVar5 = uVar4;
        } while (bVar1);
      }
    }
  }
  uVar7 = this->custompaddingtop_;
  puVar2 = puVar3;
  if (uVar7 != 0) {
    if (stream->end_ <= puVar3) {
      puVar3 = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,puVar3);
      uVar7 = this->custompaddingtop_;
    }
    *puVar3 = 'P';
    puVar3[1] = (byte)uVar7;
    if (uVar7 < 0x80) {
      puVar2 = puVar3 + 2;
    }
    else {
      puVar3[1] = (byte)uVar7 | 0x80;
      puVar3[2] = (uint8_t)((ulong)(long)(int)uVar7 >> 7);
      puVar2 = puVar3 + 3;
      if (0x3fff < uVar7) {
        uVar8 = (ulong)puVar3[2];
        uVar5 = (ulong)(long)(int)uVar7 >> 7;
        do {
          puVar2[-1] = (byte)uVar8 | 0x80;
          uVar4 = uVar5 >> 7;
          *puVar2 = (uint8_t)uVar4;
          puVar2 = puVar2 + 1;
          uVar8 = uVar4 & 0xffffffff;
          bVar1 = 0x3fff < uVar5;
          uVar5 = uVar4;
        } while (bVar1);
      }
    }
  }
  uVar7 = this->custompaddingbottom_;
  if (uVar7 != 0) {
    puVar3 = puVar2;
    if (stream->end_ <= puVar2) {
      puVar3 = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,puVar2);
      uVar7 = this->custompaddingbottom_;
    }
    *puVar3 = 'X';
    puVar3[1] = (byte)uVar7;
    if (uVar7 < 0x80) {
      puVar2 = puVar3 + 2;
    }
    else {
      puVar3[1] = (byte)uVar7 | 0x80;
      puVar3[2] = (uint8_t)((ulong)(long)(int)uVar7 >> 7);
      puVar2 = puVar3 + 3;
      if (0x3fff < uVar7) {
        uVar8 = (ulong)puVar3[2];
        uVar5 = (ulong)(long)(int)uVar7 >> 7;
        do {
          puVar2[-1] = (byte)uVar8 | 0x80;
          uVar4 = uVar5 >> 7;
          *puVar2 = (uint8_t)uVar4;
          puVar2 = puVar2 + 1;
          uVar8 = uVar4 & 0xffffffff;
          bVar1 = 0x3fff < uVar5;
          uVar5 = uVar4;
        } while (bVar1);
      }
    }
  }
  uVar7 = this->custompaddingleft_;
  puVar3 = puVar2;
  if (uVar7 != 0) {
    if (stream->end_ <= puVar2) {
      puVar2 = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,puVar2);
      uVar7 = this->custompaddingleft_;
    }
    *puVar2 = '`';
    puVar2[1] = (byte)uVar7;
    if (uVar7 < 0x80) {
      puVar3 = puVar2 + 2;
    }
    else {
      puVar2[1] = (byte)uVar7 | 0x80;
      puVar2[2] = (uint8_t)((ulong)(long)(int)uVar7 >> 7);
      puVar3 = puVar2 + 3;
      if (0x3fff < uVar7) {
        uVar8 = (ulong)puVar2[2];
        uVar5 = (ulong)(long)(int)uVar7 >> 7;
        do {
          puVar3[-1] = (byte)uVar8 | 0x80;
          uVar4 = uVar5 >> 7;
          *puVar3 = (uint8_t)uVar4;
          puVar3 = puVar3 + 1;
          uVar8 = uVar4 & 0xffffffff;
          bVar1 = 0x3fff < uVar5;
          uVar5 = uVar4;
        } while (bVar1);
      }
    }
  }
  uVar7 = this->custompaddingright_;
  if (uVar7 != 0) {
    puVar2 = puVar3;
    if (stream->end_ <= puVar3) {
      puVar2 = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,puVar3);
      uVar7 = this->custompaddingright_;
    }
    *puVar2 = 'h';
    puVar2[1] = (byte)uVar7;
    if (uVar7 < 0x80) {
      puVar3 = puVar2 + 2;
    }
    else {
      puVar2[1] = (byte)uVar7 | 0x80;
      puVar2[2] = (uint8_t)((ulong)(long)(int)uVar7 >> 7);
      puVar3 = puVar2 + 3;
      if (0x3fff < uVar7) {
        uVar8 = (ulong)puVar2[2];
        uVar5 = (ulong)(long)(int)uVar7 >> 7;
        do {
          puVar3[-1] = (byte)uVar8 | 0x80;
          uVar4 = uVar5 >> 7;
          *puVar3 = (uint8_t)uVar4;
          puVar3 = puVar3 + 1;
          uVar8 = uVar4 & 0xffffffff;
          bVar1 = 0x3fff < uVar5;
          uVar5 = uVar4;
        } while (bVar1);
      }
    }
  }
  if (this->countexcludepadding_ == true) {
    uVar6 = '\x01';
    if (stream->end_ <= puVar3) {
      puVar3 = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,puVar3);
      uVar6 = this->countexcludepadding_;
    }
    *puVar3 = 'p';
    puVar3[1] = uVar6;
    puVar3 = puVar3 + 2;
  }
  uVar7 = this->paddingtype_;
  puVar2 = puVar3;
  if (uVar7 != 0) {
    if (stream->end_ <= puVar3) {
      puVar3 = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,puVar3);
      uVar7 = this->paddingtype_;
    }
    *puVar3 = 'x';
    puVar3[1] = (byte)uVar7;
    if (uVar7 < 0x80) {
      puVar2 = puVar3 + 2;
    }
    else {
      puVar3[1] = (byte)uVar7 | 0x80;
      puVar3[2] = (uint8_t)((ulong)(long)(int)uVar7 >> 7);
      puVar2 = puVar3 + 3;
      if (0x3fff < uVar7) {
        uVar8 = (ulong)puVar3[2];
        uVar5 = (ulong)(long)(int)uVar7 >> 7;
        do {
          puVar2[-1] = (byte)uVar8 | 0x80;
          uVar4 = uVar5 >> 7;
          *puVar2 = (uint8_t)uVar4;
          puVar2 = puVar2 + 1;
          uVar8 = uVar4 & 0xffffffff;
          bVar1 = 0x3fff < uVar5;
          uVar5 = uVar4;
        } while (bVar1);
      }
    }
  }
  uVar5 = (this->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar5 & 1) != 0) {
    uVar5 = uVar5 & 0xfffffffffffffffc;
    data = *(void **)(uVar5 + 8);
    size = (int)*(undefined8 *)(uVar5 + 0x10);
    __n = (size_t)size;
    if ((long)stream->end_ - (long)puVar2 < (long)__n) {
      puVar2 = google::protobuf::io::EpsCopyOutputStream::WriteRawFallback(stream,data,size,puVar2);
      return puVar2;
    }
    memcpy(puVar2,data,__n);
    puVar2 = puVar2 + __n;
  }
  return puVar2;
}

Assistant:

uint8_t* Pooling3DLayerParams::_InternalSerialize(
    uint8_t* target, ::PROTOBUF_NAMESPACE_ID::io::EpsCopyOutputStream* stream) const {
  // @@protoc_insertion_point(serialize_to_array_start:CoreML.Specification.Pooling3DLayerParams)
  uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  // .CoreML.Specification.Pooling3DLayerParams.PoolingType3D type = 1;
  if (this->_internal_type() != 0) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteEnumToArray(
      1, this->_internal_type(), target);
  }

  // int32 kernelDepth = 2;
  if (this->_internal_kerneldepth() != 0) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteInt32ToArray(2, this->_internal_kerneldepth(), target);
  }

  // int32 kernelHeight = 3;
  if (this->_internal_kernelheight() != 0) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteInt32ToArray(3, this->_internal_kernelheight(), target);
  }

  // int32 kernelWidth = 4;
  if (this->_internal_kernelwidth() != 0) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteInt32ToArray(4, this->_internal_kernelwidth(), target);
  }

  // int32 strideDepth = 5;
  if (this->_internal_stridedepth() != 0) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteInt32ToArray(5, this->_internal_stridedepth(), target);
  }

  // int32 strideHeight = 6;
  if (this->_internal_strideheight() != 0) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteInt32ToArray(6, this->_internal_strideheight(), target);
  }

  // int32 strideWidth = 7;
  if (this->_internal_stridewidth() != 0) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteInt32ToArray(7, this->_internal_stridewidth(), target);
  }

  // int32 customPaddingFront = 8;
  if (this->_internal_custompaddingfront() != 0) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteInt32ToArray(8, this->_internal_custompaddingfront(), target);
  }

  // int32 customPaddingBack = 9;
  if (this->_internal_custompaddingback() != 0) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteInt32ToArray(9, this->_internal_custompaddingback(), target);
  }

  // int32 customPaddingTop = 10;
  if (this->_internal_custompaddingtop() != 0) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteInt32ToArray(10, this->_internal_custompaddingtop(), target);
  }

  // int32 customPaddingBottom = 11;
  if (this->_internal_custompaddingbottom() != 0) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteInt32ToArray(11, this->_internal_custompaddingbottom(), target);
  }

  // int32 customPaddingLeft = 12;
  if (this->_internal_custompaddingleft() != 0) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteInt32ToArray(12, this->_internal_custompaddingleft(), target);
  }

  // int32 customPaddingRight = 13;
  if (this->_internal_custompaddingright() != 0) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteInt32ToArray(13, this->_internal_custompaddingright(), target);
  }

  // bool countExcludePadding = 14;
  if (this->_internal_countexcludepadding() != 0) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteBoolToArray(14, this->_internal_countexcludepadding(), target);
  }

  // .CoreML.Specification.Pooling3DLayerParams.Pooling3DPaddingType paddingType = 15;
  if (this->_internal_paddingtype() != 0) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteEnumToArray(
      15, this->_internal_paddingtype(), target);
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    target = stream->WriteRaw(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).data(),
        static_cast<int>(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).size()), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:CoreML.Specification.Pooling3DLayerParams)
  return target;
}